

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O3

int xmlconfTestCases(xmlDocPtr doc,xmlNodePtr cur,int level)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char *__s2;
  stat64 *psVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  int *piVar13;
  uint uVar14;
  char *pcVar15;
  int level_00;
  uint uVar16;
  char **ppcVar17;
  uint uVar18;
  stat64 *psVar19;
  int iVar20;
  _xmlNode *cur_00;
  xmlParserCtxtPtr ctxt;
  char buf [500];
  char *local_290;
  char *local_278;
  long local_268;
  stat64 local_228 [3];
  
  level_00 = 2;
  iVar20 = 0;
  if (level == 1) {
    lVar5 = xmlGetProp(cur,"PROFILE");
    if (lVar5 != 0) {
      printf("Test cases: %s\n",lVar5);
      (*_xmlFree)(lVar5);
      bVar2 = 1;
      goto LAB_0010288a;
    }
    level_00 = 1;
  }
  bVar2 = 0;
LAB_0010288a:
  cur_00 = cur->children;
  if (cur_00 != (_xmlNode *)0x0) {
    uVar18 = 0;
    iVar20 = 0;
    do {
      if (cur_00->type == XML_ELEMENT_NODE) {
        iVar3 = xmlStrEqual(cur_00->name,"TESTCASES");
        if (iVar3 == 0) {
          iVar3 = xmlStrEqual(cur_00->name,"TEST");
          if (iVar3 == 0) {
            xmlconfTestCases_cold_1();
          }
          else {
            testErrorsSize = 0;
            testErrors[0] = '\0';
            nbError = 0;
            nbFatal = 0;
            __s2 = (char *)xmlGetProp(cur_00,"ID");
            if (__s2 == (char *)0x0) {
              uVar12 = xmlGetLineNo(cur_00);
              test_log("test missing ID, line %ld\n",uVar12);
            }
            else {
              if (skipped_tests[0] != (char *)0x0) {
                ppcVar17 = skipped_tests;
                pcVar15 = skipped_tests[0];
                do {
                  ppcVar17 = ppcVar17 + 1;
                  iVar3 = strcmp(pcVar15,__s2);
                  if (iVar3 == 0) {
                    uVar16 = 0;
                    test_log("Skipping test %s from skipped list\n",__s2);
                    nb_skipped = nb_skipped + 1;
                    goto LAB_00103022;
                  }
                  pcVar15 = *ppcVar17;
                } while (pcVar15 != (char *)0x0);
              }
              lVar5 = xmlGetProp(cur_00,"TYPE");
              if (lVar5 == 0) {
                test_log("test %s missing TYPE\n",__s2);
                uVar16 = 0xffffffff;
LAB_00103022:
                (*_xmlFree)(__s2);
              }
              else {
                psVar6 = (stat64 *)xmlGetProp(cur_00,"URI");
                if (psVar6 == (stat64 *)0x0) {
                  test_log("test %s missing URI\n",__s2);
                  local_290 = (char *)0x0;
                  lVar7 = 0;
LAB_00102ca2:
                  uVar16 = 0xffffffff;
                  local_278 = (char *)0x0;
LAB_00102fd3:
                  (*_xmlFree)(lVar5);
                }
                else {
                  lVar7 = xmlNodeGetBase(doc,cur_00);
                  psVar19 = psVar6;
                  if (lVar7 != 0) {
                    snprintf((char *)local_228,500,"%s/%s",lVar7,psVar6);
                    psVar19 = local_228;
                  }
                  local_290 = (char *)xmlStrdup(psVar19);
                  iVar3 = stat64(local_290,local_228);
                  if ((iVar3 == -1) || ((local_228[0].st_mode & 0xf000) != 0x8000)) {
                    pcVar15 = local_290;
                    if (local_290 == (char *)0x0) {
                      pcVar15 = "NULL";
                    }
                    test_log("test %s missing file %s \n",__s2,pcVar15);
                    goto LAB_00102ca2;
                  }
                  lVar8 = xmlGetProp(cur_00,"VERSION");
                  lVar9 = xmlGetProp(cur_00,"ENTITIES");
                  iVar3 = xmlStrEqual(lVar9,"none");
                  uVar14 = 0;
                  if (iVar3 == 0) {
                    uVar14 = 6;
                  }
                  local_278 = (char *)xmlGetProp(cur_00,"RECOMMENDATION");
                  if ((((local_278 == (char *)0x0) ||
                       (iVar3 = xmlStrEqual(local_278,"XML1.0"), iVar3 != 0)) ||
                      (iVar3 = xmlStrEqual(local_278,"XML1.0-errata2e"), iVar3 != 0)) ||
                     ((iVar3 = xmlStrEqual(local_278,"XML1.0-errata3e"), iVar3 != 0 ||
                      (iVar3 = xmlStrEqual(local_278,"XML1.0-errata4e"), iVar3 != 0)))) {
                    bVar1 = true;
                    if ((lVar8 == 0) || (iVar3 = xmlStrEqual(lVar8,"1.0"), iVar3 != 0))
                    goto LAB_00102afa;
                    local_268 = 0;
                    test_log("Skipping test %s for %s\n",__s2,lVar8);
                    nb_skipped = nb_skipped + 1;
                    uVar16 = 0;
                  }
                  else {
                    iVar3 = xmlStrEqual(local_278,"NS1.0");
                    if (iVar3 == 0) {
                      iVar3 = xmlStrEqual(local_278,"NS1.0-errata1e");
                      uVar16 = 0;
                      bVar1 = false;
                      if (iVar3 == 0) {
                        test_log("Skipping test %s for REC %s\n",__s2,local_278);
                        nb_skipped = nb_skipped + 1;
                        local_268 = 0;
                        goto LAB_00102f94;
                      }
                    }
                    else {
                      bVar1 = false;
                    }
LAB_00102afa:
                    local_268 = xmlGetProp(cur_00,"EDITION");
                    uVar16 = uVar14;
                    if (local_268 != 0) {
                      lVar10 = xmlStrchr(local_268,0x35);
                      uVar16 = uVar14 + 0x20000;
                      if (lVar10 != 0) {
                        uVar16 = uVar14;
                      }
                    }
                    xmlResetLastError();
                    testErrorsSize = 0;
                    testErrors[0] = '\0';
                    iVar3 = xmlMemUsed();
                    iVar4 = xmlStrEqual(lVar5,"not-wf");
                    if (iVar4 == 0) {
                      iVar4 = xmlStrEqual(lVar5,"valid");
                      if (iVar4 == 0) {
                        iVar4 = xmlStrEqual(lVar5,"invalid");
                        if (iVar4 == 0) {
                          iVar3 = xmlStrEqual(lVar5,"error");
                          if (iVar3 == 0) {
                            test_log("test %s unknown TYPE value %s\n",__s2,lVar5);
                            uVar16 = 0xffffffff;
                          }
                          else {
                            uVar16 = 0;
                            test_log("Skipping error test %s \n",__s2);
                            nb_skipped = nb_skipped + 1;
                          }
                          goto LAB_00102f94;
                        }
                        lVar10 = xmlNewParserCtxt();
                        if (lVar10 == 0) goto LAB_00102e94;
                        xmlCtxtSetErrorHandler(lVar10,testErrorHandler,0);
                        lVar11 = xmlCtxtReadFile(lVar10,local_290,0,uVar16 | 0x10);
                        if (lVar11 == 0) {
                          test_log("test %s : %s invalid document turned not well-formed too\n",__s2
                                   ,local_290);
                        }
                        else {
                          if ((*(int *)(lVar10 + 0x98) != 0) ||
                             ((*(byte *)(lVar11 + 0xac) & 8) != 0)) {
                            test_log("test %s : %s failed to detect invalid document\n",__s2,
                                     local_290);
                            nb_errors = nb_errors + 1;
                          }
                          xmlFreeDoc(lVar11);
                        }
                        goto LAB_00102f50;
                      }
                      lVar10 = xmlNewParserCtxt();
                      if (lVar10 != 0) {
                        xmlCtxtSetErrorHandler(lVar10,testErrorHandler,0);
                        lVar11 = xmlCtxtReadFile(lVar10,local_290,0,uVar16 | 0x10);
                        if (lVar11 == 0) {
                          test_log("test %s : %s failed to parse a valid document\n",__s2,local_290)
                          ;
                          nb_errors = nb_errors + 1;
                        }
                        else {
                          if ((*(int *)(lVar10 + 0x98) == 0) ||
                             ((*(byte *)(lVar11 + 0xac) & 8) == 0)) {
                            test_log("test %s : %s failed to validate a valid document\n",__s2,
                                     local_290);
                            nb_errors = nb_errors + 1;
                          }
                          xmlFreeDoc(lVar11);
                        }
                        goto LAB_00102f50;
                      }
LAB_00102e94:
                      test_log("test %s : %s out of memory\n",__s2,local_290);
                    }
                    else {
                      lVar10 = xmlNewParserCtxt();
                      xmlCtxtSetErrorHandler(lVar10,testErrorHandler,0);
                      lVar11 = xmlCtxtReadFile(lVar10,local_290,0,uVar16);
                      if (bVar1) {
                        if (lVar11 != 0) {
                          test_log("test %s : %s failed to detect not well formedness\n",__s2,
                                   local_290);
                          nb_errors = nb_errors + 1;
LAB_00102db5:
                          xmlFreeDoc(lVar11);
                        }
                      }
                      else {
                        if (lVar11 != 0) {
                          piVar13 = (int *)xmlGetLastError();
                          if ((piVar13[1] == 0) || (*piVar13 != 3)) {
                            test_log("test %s : %s failed to detect namespace error\n",__s2,
                                     local_290);
                            nb_errors = nb_errors + 1;
                          }
                          goto LAB_00102db5;
                        }
                        test_log("test %s : %s failed to parse the XML\n",__s2,local_290);
                        nb_errors = nb_errors + 1;
                      }
LAB_00102f50:
                      xmlFreeParserCtxt(lVar10);
                    }
                    xmlResetLastError();
                    iVar4 = xmlMemUsed();
                    if (iVar4 - iVar3 != 0 && iVar3 <= iVar4) {
                      test_log("test %s : %s leaked %d bytes\n",__s2,local_290,
                               (ulong)(uint)(iVar4 - iVar3));
                      nb_leaks = nb_leaks + 1;
                    }
                    nb_tests = nb_tests + 1;
                    uVar16 = 1;
                  }
LAB_00102f94:
                  (*_xmlFree)(lVar5);
                  if (lVar9 != 0) {
                    (*_xmlFree)();
                  }
                  if (local_268 != 0) {
                    (*_xmlFree)();
                  }
                  lVar5 = lVar8;
                  if (lVar8 != 0) goto LAB_00102fd3;
                }
                if (local_290 != (char *)0x0) {
                  (*_xmlFree)();
                }
                if (psVar6 != (stat64 *)0x0) {
                  (*_xmlFree)(psVar6);
                }
                if (lVar7 != 0) {
                  (*_xmlFree)(lVar7);
                }
                (*_xmlFree)(__s2);
                __s2 = local_278;
                if (local_278 != (char *)0x0) goto LAB_00103022;
              }
              iVar20 = iVar20 - ((int)~uVar16 >> 0x1f);
            }
            uVar18 = uVar18 + 1;
          }
        }
        else {
          iVar3 = xmlconfTestCases(doc,cur_00,level_00);
          iVar20 = iVar20 + iVar3;
        }
      }
      cur_00 = cur_00->next;
    } while (cur_00 != (_xmlNode *)0x0);
    if ((bool)(bVar2 & 0 < (int)uVar18)) {
      printf("Test cases: %d tests\n",(ulong)uVar18);
    }
  }
  return iVar20;
}

Assistant:

static int
xmlconfTestCases(xmlDocPtr doc, xmlNodePtr cur, int level) {
    xmlChar *profile;
    int ret = 0;
    int tests = 0;
    int output = 0;

    if (level == 1) {
	profile = xmlGetProp(cur, BAD_CAST "PROFILE");
	if (profile != NULL) {
	    output = 1;
	    level++;
	    printf("Test cases: %s\n", (char *) profile);
	    xmlFree(profile);
	}
    }
    cur = cur->children;
    while (cur != NULL) {
        /* look only at elements we ignore everything else */
        if (cur->type == XML_ELEMENT_NODE) {
	    if (xmlStrEqual(cur->name, BAD_CAST "TESTCASES")) {
	        ret += xmlconfTestCases(doc, cur, level);
	    } else if (xmlStrEqual(cur->name, BAD_CAST "TEST")) {
	        if (xmlconfTestItem(doc, cur) >= 0)
		    ret++;
		tests++;
	    } else {
	        fprintf(stderr, "Unhandled element %s\n", (char *)cur->name);
	    }
	}
        cur = cur->next;
    }
    if (output == 1) {
	if (tests > 0)
	    printf("Test cases: %d tests\n", tests);
    }
    return(ret);
}